

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_cs.h
# Opt level: O0

void __thiscall TradeWrap::TradeWrap(TradeWrap *this,Trade *trade)

{
  char *pcVar1;
  Trade *trade_local;
  TradeWrap *this_local;
  
  std::__cxx11::string::string((string *)&this->_account_id);
  std::__cxx11::string::string((string *)&this->_code);
  std::__cxx11::string::string((string *)&this->_name);
  std::__cxx11::string::string((string *)&this->_entrust_no);
  std::__cxx11::string::string((string *)&this->_entrust_action);
  std::__cxx11::string::string((string *)&this->_fill_no);
  pcVar1 = _T(&trade->account_id,&this->_account_id);
  this->account_id = pcVar1;
  pcVar1 = _T(&trade->code,&this->_code);
  this->code = pcVar1;
  pcVar1 = _T(&trade->name,&this->_name);
  this->name = pcVar1;
  pcVar1 = _T(&trade->entrust_no,&this->_entrust_no);
  this->entrust_no = pcVar1;
  pcVar1 = _T(&trade->entrust_action,&this->_entrust_action);
  this->entrust_action = pcVar1;
  pcVar1 = _T(&trade->fill_no,&this->_fill_no);
  this->fill_no = pcVar1;
  this->fill_size = trade->fill_size;
  this->fill_price = trade->fill_price;
  this->fill_date = trade->fill_date;
  this->fill_time = trade->fill_time;
  this->order_id = trade->order_id;
  return;
}

Assistant:

TradeWrap(const Trade* trade)
    {
        account_id     = _T( trade->account_id    , _account_id     );
        code           = _T( trade->code          , _code           );
        name           = _T( trade->name          , _name           );
        entrust_no     = _T( trade->entrust_no    , _entrust_no     );
        entrust_action = _T( trade->entrust_action, _entrust_action );
        fill_no        = _T( trade->fill_no       , _fill_no        );
        fill_size      = trade->fill_size           ;
        fill_price     = trade->fill_price          ;
        fill_date      = trade->fill_date           ;
        fill_time      = trade->fill_time           ;
        order_id       = trade->order_id            ;
    }